

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall
amrex::Amr::initialInit
          (Amr *this,Real strt_time,Real stop_time,BoxArray *lev0_grids,
          Vector<int,_std::allocator<int>_> *pmap)

{
  BoxArray *in_RDX;
  Real in_RSI;
  Vector<int,_std::allocator<int>_> *in_RDI;
  Amr *in_XMM0_Qa;
  Real in_XMM1_Qa;
  Real in_stack_00000350;
  Real in_stack_00000358;
  Amr *in_stack_00000360;
  
  InitializeInit(in_XMM0_Qa,in_XMM1_Qa,in_RSI,in_RDX,in_RDI);
  FinalizeInit(in_stack_00000360,in_stack_00000358,in_stack_00000350);
  return;
}

Assistant:

void
Amr::initialInit (Real              strt_time,
                  Real              stop_time,
                  const BoxArray*   lev0_grids,
                  const Vector<int>* pmap)
{
    BL_PROFILE("Amr::initialInit()");
    InitializeInit(strt_time, stop_time, lev0_grids, pmap);

    // This is a subtlety, but in the case where we are initializing the data
    //   from a plotfile, we want to use the time read in from the plotfile as
    //   the start time instead of using "strt_time".
    // The Amr data "cumtime" has been set in InitializeInit; if we are restarting
    //   from a plotfile, then cumtime must be re-defined in that initialization routine.
    //   Thus here we pass "cumtime" rather than "strt_time" to FinalizeInit.
    FinalizeInit  (cumtime, stop_time);
}